

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::UpdateWaterLevel(AActor *this,bool dosplash)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sector_t *this_00;
  extsector_t *peVar4;
  F3DFloor **ppFVar5;
  undefined8 *puVar6;
  double *pdVar7;
  bool bVar8;
  int iVar9;
  sector_t_conflict *psVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  DVector3 local_38;
  
  iVar9 = this->waterlevel;
  this->waterlevel = 0;
  this_00 = this->Sector;
  if (this_00 == (sector_t *)0x0) {
    return false;
  }
  if ((this_00->MoreFlags & 0x20) != 0) {
    this->waterlevel = 3;
    local_38.Z = -3.4028234663852886e+38;
    bVar8 = false;
    goto LAB_00427405;
  }
  psVar10 = sector_t::GetHeightSec(this_00);
  if (psVar10 == (sector_t_conflict *)0x0) {
    peVar4 = this->Sector->e;
    uVar12 = (ulong)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar12 == 0) {
      local_38.Z = -3.4028234663852886e+38;
      bVar8 = false;
    }
    else {
      ppFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      dVar1 = (this->__Pos).X;
      dVar2 = (this->__Pos).Y;
      dVar3 = (this->__Pos).Z;
      dVar16 = this->Height * 0.5 + dVar3;
      dVar15 = this->Height + dVar3;
      lVar13 = 0;
      dVar17 = -3.4028234663852886e+38;
      do {
        puVar6 = *(undefined8 **)((long)ppFVar5 + lVar13);
        if ((*(uint *)(puVar6 + 0xb) & 0x13) == 0x11) {
          pdVar7 = (double *)puVar6[5];
          local_38.Z = (pdVar7[1] * dVar2 + *pdVar7 * dVar1 + pdVar7[3]) * pdVar7[4];
          if ((local_38.Z <= dVar3) ||
             (pdVar7 = (double *)*puVar6,
             dVar16 < (pdVar7[1] * dVar2 + *pdVar7 * dVar1 + pdVar7[3]) * pdVar7[4]))
          goto LAB_00427339;
          bVar14 = true;
          if ((dVar3 < local_38.Z) && (this->waterlevel = 1, dVar16 < local_38.Z)) {
            this->waterlevel = 2;
            dVar17 = dVar15;
            if (this->player == (player_t *)0x0) {
joined_r0x004273a4:
              if (local_38.Z < dVar17) goto LAB_0042733f;
            }
            else if (local_38.Z < dVar15) {
              dVar17 = this->player->viewheight + dVar3;
              goto joined_r0x004273a4;
            }
            this->waterlevel = 3;
          }
        }
        else {
LAB_00427339:
          bVar14 = false;
          local_38.Z = dVar17;
        }
LAB_0042733f:
        bVar8 = false;
      } while ((!bVar14) &&
              (bVar14 = uVar12 * 8 + -8 != lVar13, lVar13 = lVar13 + 8, dVar17 = local_38.Z,
              bVar8 = false, bVar14));
    }
    goto LAB_00427405;
  }
  dVar1 = (this->__Pos).X;
  dVar2 = (this->__Pos).Y;
  local_38.Z = ((psVar10->floorplane).normal.Y * dVar2 +
               (psVar10->floorplane).normal.X * dVar1 + (psVar10->floorplane).D) *
               (psVar10->floorplane).negiC;
  dVar3 = (this->__Pos).Z;
  if (local_38.Z <= dVar3) {
    if (((psVar10->MoreFlags & 2) != 0) ||
       (iVar11 = 3,
       dVar3 + this->Height <=
       (dVar2 * (psVar10->ceilingplane).normal.Y +
       dVar1 * (psVar10->ceilingplane).normal.X + (psVar10->ceilingplane).D) *
       (psVar10->ceilingplane).negiC)) {
      iVar11 = 0;
    }
LAB_004273f4:
    this->waterlevel = iVar11;
  }
  else {
    this->waterlevel = 1;
    dVar1 = this->Height;
    if (dVar1 * 0.5 + dVar3 < local_38.Z) {
      this->waterlevel = 2;
      if (this->player != (player_t *)0x0) {
        iVar11 = 3;
        if (dVar1 + dVar3 <= local_38.Z) goto LAB_004273f4;
        dVar1 = this->player->viewheight;
      }
      iVar11 = 3;
      if (dVar3 + dVar1 <= local_38.Z) goto LAB_004273f4;
    }
  }
  bVar8 = (psVar10->MoreFlags & 0x60) == 0;
LAB_00427405:
  if ((this->waterlevel != 0 && this->boomwaterlevel == '\0') && dosplash) {
    local_38.X = (this->__Pos).X;
    local_38.Y = (this->__Pos).Y;
    P_HitWater(this,this->Sector,&local_38,true,true,false);
  }
  this->boomwaterlevel = (BYTE)this->waterlevel;
  if (bVar8) {
    this->waterlevel = (uint)(byte)iVar9;
  }
  return false;
}

Assistant:

bool AActor::UpdateWaterLevel (bool dosplash)
{
	BYTE lastwaterlevel = waterlevel;
	double fh = -FLT_MAX;
	bool reset=false;

	waterlevel = 0;

	if (Sector == NULL)
	{
		return false;
	}

	if (Sector->MoreFlags & SECF_UNDERWATER)	// intentionally not SECF_UNDERWATERMASK
	{
		waterlevel = 3;
	}
	else
	{
		const sector_t *hsec = Sector->GetHeightSec();
		if (hsec != NULL)
		{
			fh = hsec->floorplane.ZatPoint (this);
			//if (hsec->MoreFlags & SECF_UNDERWATERMASK)	// also check Boom-style non-swimmable sectors
			{
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}
				else if (!(hsec->MoreFlags & SECF_FAKEFLOORONLY) && (Top() > hsec->ceilingplane.ZatPoint (this)))
				{
					waterlevel = 3;
				}
				else
				{
					waterlevel = 0;
				}
			}
			// even non-swimmable deep water must be checked here to do the splashes correctly
			// But the water level must be reset when this function returns
			if (!(hsec->MoreFlags&SECF_UNDERWATERMASK))
			{
				reset = true;
			}
		}
		else
		{
			// Check 3D floors as well!
			for(auto rover : Sector->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if(!(rover->flags & FF_SWIMMABLE) || rover->flags & FF_SOLID) continue;

				double ff_bottom=rover->bottom.plane->ZatPoint(this);
				double ff_top=rover->top.plane->ZatPoint(this);

				if(ff_top <= Z() || ff_bottom > (Center())) continue;
				
				fh=ff_top;
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}

				break;
			}
		}
	}
		
	// some additional checks to make deep sectors like Boom's splash without setting
	// the water flags. 
	if (boomwaterlevel == 0 && waterlevel != 0 && dosplash) 
	{
		P_HitWater(this, Sector, PosAtZ(fh), true);
	}
	boomwaterlevel = waterlevel;
	if (reset)
	{
		waterlevel = lastwaterlevel;
	}
	return false;	// we did the splash ourselves
}